

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
gdscpp::findRootSTR(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                   gdscpp *this)

{
  iterator __position;
  long lVar1;
  bool bVar2;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar3;
  int iVar4;
  pointer pgVar5;
  ulong uVar6;
  ulong uVar7;
  uint *puVar8;
  ulong uVar9;
  bool bVar10;
  uint local_3c;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Finding the root structures.",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c = 0;
  pvVar3 = (vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__;
  if ((this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      local_38 = pvVar3;
      if ((this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
          super__Vector_impl_data._M_start) {
LAB_0010a172:
        __position._M_current = *(uint **)((long)__return_storage_ptr__ + 8);
        if (__position._M_current == *(uint **)((long)__return_storage_ptr__ + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     __position,&local_3c);
        }
        else {
          *__position._M_current = local_3c;
          *(uint **)((long)__return_storage_ptr__ + 8) = __position._M_current + 1;
        }
      }
      else {
        uVar7 = 0;
        bVar2 = false;
        do {
          pgVar5 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&pgVar5[uVar7].SREF.super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>.
                       _M_impl + 8) !=
              *(pointer *)
               &pgVar5[uVar7].SREF.super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl) {
            uVar6 = 1;
            do {
              iVar4 = std::__cxx11::string::compare((string *)(pgVar5 + local_3c));
              if (iVar4 == 0) {
                bVar2 = true;
                break;
              }
              pgVar5 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar9 = ((long)*(pointer *)
                              ((long)&pgVar5[uVar7].SREF.
                                      super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl
                              + 8) -
                       *(long *)&pgVar5[uVar7].SREF.
                                 super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl >> 3)
                      * -0x1111111111111111;
              bVar10 = uVar6 <= uVar9;
              lVar1 = uVar9 - uVar6;
              uVar6 = (ulong)((int)uVar6 + 1);
            } while (bVar10 && lVar1 != 0);
          }
        } while ((!bVar2) &&
                (uVar7 = (ulong)((int)uVar7 + 1),
                uVar6 = ((long)(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) * -0x1084210842108421,
                uVar7 <= uVar6 && uVar6 - uVar7 != 0));
        __return_storage_ptr__ = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38;
        if (!bVar2) goto LAB_0010a172;
      }
      local_3c = local_3c + 1;
      uVar7 = ((long)(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x1084210842108421;
      pvVar3 = local_38;
    } while (local_3c <= uVar7 && uVar7 - local_3c != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Root GDS structures: ",0x15);
  puVar8 = *(uint **)__return_storage_ptr__;
  if (puVar8 != *(uint **)((long)__return_storage_ptr__ + 8)) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      pgVar5 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pgVar5[*puVar8].name._M_dataplus._M_p,
                 pgVar5[*puVar8].name._M_string_length);
      puVar8 = puVar8 + 1;
    } while (puVar8 != *(uint **)((long)__return_storage_ptr__ + 8));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         (vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__;
}

Assistant:

vector<unsigned int> gdscpp::findRootSTR()
{
  cout << "Finding the root structures." << endl;

  vector<unsigned int> rootSTRindexes;
  bool vecFound;

  for (unsigned int i = 0; i < this->STR.size(); i++) {
    vecFound = false;
    for (unsigned int j = 0; j < this->STR.size(); j++) {
      for (unsigned int k = 0; k < this->STR[j].SREF.size(); k++) {
        if (!this->STR[i].name.compare(this->STR[j].SREF[k].name)) {
          vecFound = true;
          break;
        }
      }
      if (vecFound) {
        break;
      }
    }
    if (vecFound == false) {
      rootSTRindexes.push_back(i);
    }
  }

  // display the root GDS STR
  cout << "Root GDS structures: ";

  vector<unsigned int>::iterator fooVec;
  for (fooVec = rootSTRindexes.begin(); fooVec != rootSTRindexes.end();
       fooVec++) {
    cout << "  " << this->STR[*fooVec].name;
  }
  cout << endl;

  return rootSTRindexes;
}